

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timeout.c
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  
  ss = socket(2,2,0);
  if (-1 < ss) {
    memset(&query_server,0,0x10);
    query_server.sin_family = 2;
    query_server.sin_port = 0x3500;
    iVar1 = inet_pton(2,"127.0.0.1",&query_server.sin_addr);
    return iVar1;
  }
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  log_log(5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_timeout.c"
          ,0x22,"%s:%s","socket open error",pcVar3);
  exit(1);
}

Assistant:

int init(){
  #ifdef _WIN64
    WSADATA wsaData;
    int x;
    if(x=WSAStartup(MAKEWORD(2,2),&wsaData)!=0){//协商版本winsock 2.2
      log_fatal_exit_shortcut("winsock init error");
    }
    system("chcp 65001");//修改控制台格式为65001
  #endif
    
    if( (ss = socket(AF_INET, SOCK_DGRAM, 0))<0){
      log_fatal_exit_shortcut("socket open error");
  }
  memset(&query_server, 0, ADDR_LEN);
  query_server.sin_family = AF_INET;
  query_server.sin_port = htons(DNS_SERVER_PORT);
  inet_pton(AF_INET,"127.0.0.1",&query_server.sin_addr.s_addr);
}